

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O0

void movePack_print_json(MovePack *movePack)

{
  ulong *in_RDI;
  uchar i;
  byte local_9;
  
  printf("[");
  for (local_9 = 0; (ulong)local_9 < *in_RDI; local_9 = local_9 + 1) {
    if (local_9 != 0) {
      printf(",");
    }
    move_print_json((Move *)movePack);
  }
  printf("]");
  return;
}

Assistant:

void movePack_print_json(MovePack * movePack)
{
	unsigned char i;
	printf("[");
	for(i=0;i<movePack->movesCount;i++)
	{
		if(i>0)
			printf(",");
		move_print_json(movePack->moves[i]);
	}
	printf("]");
}